

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

bool __thiscall table::updatecheck(table *this,UpdateStatement *stmt)

{
  ExprType EVar1;
  pointer ppcVar2;
  pointer pcVar3;
  char *str2;
  column *pcVar4;
  size_t sVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  Expr *pEVar13;
  ostream *poVar14;
  undefined8 uVar15;
  ExprType EVar16;
  long lVar17;
  pointer ppcVar18;
  char *pcVar19;
  column *pcVar20;
  table *ptVar21;
  string colName;
  fstream os;
  char *local_280;
  size_t local_278;
  char local_270 [16];
  table *local_260;
  ulong local_258;
  ulong local_250;
  column *local_248;
  string local_240 [16];
  
  std::__cxx11::string::string
            ((string *)local_240,
             (*(stmt->updates->
               super__Vector_base<hsql::UpdateClause_*,_std::allocator<hsql::UpdateClause_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->column,(allocator *)&local_280);
  ppcVar18 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_260 = this;
  if (ppcVar18 != ppcVar2) {
    do {
      pcVar20 = *ppcVar18;
      bVar6 = util::compareString(&pcVar20->name,local_240);
      if (bVar6) goto LAB_0011b221;
      ppcVar18 = ppcVar18 + 1;
    } while (ppcVar18 != ppcVar2);
  }
  pcVar20 = (column *)0x0;
LAB_0011b221:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
    operator_delete(local_240[0]._M_dataplus._M_p);
  }
  ptVar21 = local_260;
  if (pcVar20 == (column *)0x0) {
    pcVar19 = "no such column in table to update";
    lVar17 = 0x21;
  }
  else {
    if (stmt->where != (Expr *)0x0) {
      pcVar3 = (local_260->filename)._M_dataplus._M_p;
      local_280 = local_270;
      local_248 = pcVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,pcVar3,pcVar3 + (local_260->filename)._M_string_length);
      std::fstream::fstream(local_240,(string *)&local_280,_S_out|_S_in|_S_bin);
      if (local_280 != local_270) {
        operator_delete(local_280);
      }
      local_250 = 0;
      if (ptVar21->rowlength < 1) {
        local_258 = 0;
      }
      else {
        local_248 = (column *)&local_248->flag;
        local_258 = 0;
        do {
          pEVar13 = stmt->where;
          if ((pEVar13->expr2->type == kExprLiteralInt) ||
             (EVar16 = pEVar13->expr->type, EVar16 == kExprLiteralInt)) {
            local_278 = 0;
            local_270[0] = '\0';
            EVar16 = pEVar13->expr2->type;
            local_280 = local_270;
            if (EVar16 == kExprLiteralString) {
LAB_0011b309:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"cannot do compare between int and char",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              iVar9 = 1;
              goto LAB_0011b604;
            }
            if (EVar16 == kExprLiteralInt) {
              if (pEVar13->expr->type == kExprLiteralString) goto LAB_0011b309;
              pcVar19 = pEVar13->expr->name;
              strlen(pcVar19);
              lVar17 = 0x10;
              std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,(ulong)pcVar19);
            }
            else {
              pcVar19 = pEVar13->expr2->name;
              strlen(pcVar19);
              lVar17 = 8;
              std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,(ulong)pcVar19);
            }
            sVar5 = local_278;
            pcVar19 = local_280;
            ppcVar18 = (ptVar21->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppcVar2 = (ptVar21->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppcVar18 == ppcVar2) {
LAB_0011b537:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"column ",7);
              ptVar21 = local_260;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_280,local_278);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," do not exist in table",0x16);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              iVar9 = 1;
              std::ostream::flush();
            }
            else {
              iVar10 = *(int *)(*(long *)((long)&stmt->where->type + lVar17) + 0x48);
              pcVar20 = (column *)0x0;
              do {
                pcVar4 = *ppcVar18;
                if ((sVar5 == (pcVar4->name)._M_string_length) &&
                   ((sVar5 == 0 ||
                    (iVar9 = bcmp(pcVar19,(pcVar4->name)._M_dataplus._M_p,sVar5), iVar9 == 0)))) {
                  pcVar20 = pcVar4;
                }
                ptVar21 = local_260;
                ppcVar18 = ppcVar18 + 1;
              } while (ppcVar18 != ppcVar2);
              if (pcVar20 == (column *)0x0) goto LAB_0011b537;
              std::istream::seekg(local_240,
                                  (long)pcVar20->col_offset +
                                  (long)(int)local_250 * (long)local_260->rowSize,0);
              iVar9 = pcVar20->element_truesize;
              if (iVar9 < 0) {
                iVar9 = -1;
              }
              piVar12 = (int *)operator_new__((long)iVar9);
              std::istream::read((char *)local_240,(long)piVar12);
              cVar7 = stmt->where->opChar;
              if (cVar7 == '=') {
                iVar9 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                pcVar19 = "cannot do = for char columns with int value";
                if (iVar9 == 0) {
LAB_0011b5b1:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar19,0x2b);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  iVar8 = 1;
                  std::ostream::flush();
                }
                else {
                  iVar8 = 4;
                  if (*piVar12 == iVar10) {
                    cVar7 = stmt->where->opChar;
                    goto LAB_0011b4b2;
                  }
                }
LAB_0011b5f9:
                operator_delete(piVar12);
                iVar9 = iVar8;
              }
              else {
LAB_0011b4b2:
                if (cVar7 == '>') {
                  iVar9 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                  pcVar19 = "cannot do > for char columns with int value";
                  if (iVar9 == 0) goto LAB_0011b5b1;
                  iVar8 = 4;
                  if (*piVar12 <= iVar10) goto LAB_0011b5f9;
                  cVar7 = stmt->where->opChar;
                }
                iVar9 = 0;
                if (cVar7 == '<') {
                  iVar8 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                  pcVar19 = "cannot do < for char columns with int value";
                  if (iVar8 == 0) goto LAB_0011b5b1;
                  iVar8 = 4;
                  if (iVar10 <= *piVar12) goto LAB_0011b5f9;
                }
              }
            }
LAB_0011b604:
            if (local_280 != local_270) {
              operator_delete(local_280);
            }
            if (iVar9 != 4) {
              if (iVar9 == 0) {
                pEVar13 = stmt->where;
                EVar16 = pEVar13->expr->type;
                goto LAB_0011b63a;
              }
LAB_0011b911:
              std::fstream::~fstream(local_240);
              if (iVar9 != 0 || (local_258 & 1) != 0) {
                return iVar9 == 0;
              }
              goto LAB_0011b92d;
            }
          }
          else {
LAB_0011b63a:
            EVar1 = pEVar13->expr2->type;
            if (EVar16 == kExprColumnRef) {
              if (EVar1 == kExprLiteralString) {
LAB_0011b666:
                local_278 = 0;
                local_270[0] = '\0';
                local_280 = local_270;
                if (pEVar13->expr2->type == kExprLiteralString) {
                  pcVar19 = pEVar13->expr->name;
                  strlen(pcVar19);
                  lVar17 = 0x10;
                  std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,(ulong)pcVar19);
                }
                else {
                  pcVar19 = pEVar13->expr2->name;
                  strlen(pcVar19);
                  lVar17 = 8;
                  std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,(ulong)pcVar19);
                }
                sVar5 = local_278;
                pcVar19 = local_280;
                ppcVar18 = (ptVar21->table_cols).
                           super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ppcVar2 = (ptVar21->table_cols).
                          super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (ppcVar18 == ppcVar2) {
LAB_0011b7da:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"column ",7);
                  ptVar21 = local_260;
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_280,local_278);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," do not exist in table",0x16);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                  std::ostream::put((char)poVar14);
                  iVar9 = 1;
                  std::ostream::flush();
                }
                else {
                  str2 = *(char **)(*(long *)((long)&stmt->where->type + lVar17) + 0x28);
                  pcVar20 = (column *)0x0;
                  do {
                    pcVar4 = *ppcVar18;
                    if ((sVar5 == (pcVar4->name)._M_string_length) &&
                       ((sVar5 == 0 ||
                        (iVar9 = bcmp(pcVar19,(pcVar4->name)._M_dataplus._M_p,sVar5), iVar9 == 0))))
                    {
                      pcVar20 = pcVar4;
                    }
                    ptVar21 = local_260;
                    ppcVar18 = ppcVar18 + 1;
                  } while (ppcVar18 != ppcVar2);
                  if (pcVar20 == (column *)0x0) goto LAB_0011b7da;
                  std::istream::seekg(local_240,
                                      (long)pcVar20->col_offset +
                                      (long)(int)local_250 * (long)local_260->rowSize,0);
                  iVar9 = pcVar20->element_truesize;
                  if (iVar9 < 0) {
                    iVar9 = -1;
                  }
                  pcVar19 = (char *)operator_new__((long)iVar9);
                  std::istream::read((char *)local_240,(long)pcVar19);
                  cVar7 = stmt->where->opChar;
                  iVar9 = 0;
                  if (cVar7 == '<') {
                    iVar10 = util::compareChar(pcVar19,str2);
                    iVar9 = 0;
                    if (iVar10 != -1) goto LAB_0011b87a;
                  }
                  else if (cVar7 == '>') {
                    iVar10 = util::compareChar(pcVar19,str2);
                    if (iVar10 != 1) goto LAB_0011b87a;
                  }
                  else if ((cVar7 == '=') && (bVar6 = util::compareString(pcVar19,str2), !bVar6)) {
LAB_0011b87a:
                    operator_delete(pcVar19);
                    iVar9 = 4;
                  }
                }
                if (local_280 != local_270) {
                  operator_delete(local_280);
                }
                if (iVar9 != 0) {
                  if (iVar9 != 4) goto LAB_0011b911;
                  goto LAB_0011b8bc;
                }
              }
              else if (EVar1 == kExprColumnRef) goto LAB_0011b8bc;
            }
            else if ((EVar16 == kExprLiteralString) || (EVar1 == kExprLiteralString))
            goto LAB_0011b666;
            uVar15 = std::__cxx11::string::compare((char *)local_248);
            local_258 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
          }
LAB_0011b8bc:
          uVar11 = (int)local_250 + 1;
          local_250 = (ulong)uVar11;
        } while ((int)uVar11 < ptVar21->rowlength);
      }
      std::fstream::close();
      std::fstream::~fstream(local_240);
      if ((local_258 & 1) != 0) {
        return true;
      }
    }
LAB_0011b92d:
    pcVar19 = "where condition is wrong";
    lVar17 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return false;
}

Assistant:

bool table::updatecheck(hsql::UpdateStatement *stmt) {
    column* col = getColumn((*stmt->updates)[0]->column);
    bool updated = false;
    if(col == NULL){
        cout << "no such column in table to update" <<endl;
        return false;
    }
    if(stmt->where == nullptr){
        //set all column to same value
    }
    else {
        fstream os(getName(), ios::in|ios::out|ios::binary);

        for (int i = 0; i < getRowlength(); i++) {
            if (stmt->where->expr2->type == hsql::kExprLiteralInt || stmt->where->expr->type == hsql::kExprLiteralInt) {
                //select column
                string colName;
                int compareNum;
                if (stmt->where->expr2->type == hsql::kExprLiteralInt) {
                    if (stmt->where->expr->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr->name;
                    compareNum = (int) stmt->where->expr2->ival;
                } else {
                    if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr2->name;
                    compareNum = (int) stmt->where->expr->ival;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do = for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if (stmt->where->opChar == '>') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do > for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes <= compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if (stmt->where->opChar == '<') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do < for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes >= compareNum) {
                        delete bytes;
                        continue;
                    }
                }

            }
            if (stmt->where->expr->type == hsql::kExprColumnRef && stmt->where->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if (stmt->where->expr2->type == hsql::kExprLiteralString ||
                stmt->where->expr->type == hsql::kExprLiteralString) {
                //select column
                string colName;
                char *compareChar;
                if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->where->expr->name;
                    compareChar = stmt->where->expr2->name;
                } else {
                    colName = stmt->where->expr2->name;
                    compareChar = stmt->where->expr->name;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (!util::compareString(bytes, compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if (stmt->where->opChar == '>') {
                    if (util::compareChar(bytes, compareChar) != 1) {
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if (stmt->where->opChar == '<') {
                    if (util::compareChar(bytes, compareChar) != -1) {
                        delete bytes;
                        continue;
                    }
                }

            }
            //do update

            if (col != NULL) {

                if (col->flag == "CHAR") {
                    if (((*stmt->updates)[0]->value)->type == hsql::kExprLiteralString) {

                        updated = true;

                    } else {

                        updated = true;
                    }
                } else {

                    updated = true;

                }
            }

        }
        os.close();
    }
    if(updated)
        return true;
    else{
        cout<<"where condition is wrong"<<endl;
        return false;
    }

}